

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

string * __thiscall
tinyformat::format<std::__cxx11::string,char_const*,unsigned_long,bool>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,char **args_1,
          unsigned_long *args_2,bool *args_3)

{
  long in_FS_OFFSET;
  ostringstream oss;
  undefined1 local_220 [376];
  FormatArg *local_a8;
  undefined4 local_a0;
  FormatArg local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  code *local_78;
  code *local_70;
  char **local_68;
  code *local_60;
  code *local_58;
  unsigned_long *local_50;
  code *local_48;
  code *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
  local_a8 = &local_98;
  local_a0 = 4;
  local_98.m_formatImpl = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_98.m_toIntImpl = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_78 = detail::FormatArg::formatImpl<char_const*>;
  local_70 = detail::FormatArg::toIntImpl<char_const*>;
  local_60 = detail::FormatArg::formatImpl<unsigned_long>;
  local_58 = detail::FormatArg::toIntImpl<unsigned_long>;
  local_48 = detail::FormatArg::formatImpl<bool>;
  local_40 = detail::FormatArg::toIntImpl<bool>;
  local_98.m_value = fmt;
  local_80 = args;
  local_68 = args_1;
  local_50 = args_2;
  detail::formatImpl((ostream *)local_220,(char *)this,local_a8,4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
  std::ios_base::~ios_base((ios_base *)(local_220 + 0x70));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}